

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::MakeCheckOpValueString<unsigned_char>(ostream *os,uchar *v)

{
  ostream *poVar1;
  uchar local_19;
  
  if ((byte)(*v - 0x20) < 0x5f) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    local_19 = *v;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_19,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"unsigned char value ",0x14);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  return;
}

Assistant:

void MakeCheckOpValueString(std::ostream* os, const unsigned char& v) {
  if (v >= 32 && v <= 126) {
    (*os) << "'" << v << "'";
  } else {
    (*os) << "unsigned char value " << (unsigned short)v;
  }
}